

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O3

void __thiscall cppurses::Terminal::initialize(Terminal *this)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  runtime_error *this_00;
  
  if (this->is_initialized_ != false) {
    return;
  }
  setlocale(6,"en_US.UTF-8");
  pcVar3 = getenv("TERM");
  lVar4 = newterm(pcVar3,_stdout,_stdin);
  if (lVar4 == 0) {
    lVar4 = newterm("xterm-256color",_stdout,_stdin);
    if (lVar4 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unable to initialize screen.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  signal(2,handle_sigint);
  this->is_initialized_ = true;
  noecho();
  keypad(_stdscr,1);
  _ESCDELAY = 1;
  mousemask(0xfffffff,0);
  mouseinterval(0);
  bVar1 = this->is_initialized_;
  if ((bool)bVar1 == true) {
    wtimeout(_stdscr,(int)(this->refresh_rate_).__r);
    bVar1 = this->is_initialized_;
  }
  if ((bVar1 & 1) != 0) {
    cVar2 = has_colors();
    if (cVar2 != '\0') {
      start_color();
      initialize_color_pairs(this);
      ncurses_set_palette(this,&this->palette_);
    }
  }
  ncurses_set_raw_mode(this);
  curs_set(this->show_cursor_);
  return;
}

Assistant:

void Terminal::initialize()
{
    if (is_initialized_)
        return;
    std::setlocale(LC_ALL, "en_US.UTF-8");

    if (::newterm(std::getenv("TERM"), stdout, stdin) == nullptr &&
        ::newterm("xterm-256color", stdout, stdin) == nullptr) {
        throw std::runtime_error{"Unable to initialize screen."};
    }
    std::signal(SIGINT, &handle_sigint);

    is_initialized_ = true;
    ::noecho();
    ::keypad(::stdscr, true);
    ::ESCDELAY = 1;
    ::mousemask(ALL_MOUSE_EVENTS, nullptr);
    ::mouseinterval(0);
    this->set_refresh_rate(refresh_rate_);
    if (this->has_color()) {
        ::start_color();
        this->initialize_color_pairs();
        this->ncurses_set_palette(palette_);
    }
    this->ncurses_set_raw_mode();
    this->ncurses_set_cursor();
}